

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O3

void __thiscall amrex::EB2::Level::buildCellFlag(Level *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  Periodicity PVar37;
  MFIter mfi;
  Box local_1ac;
  Array4<amrex::EBCellFlag> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  lVar13 = 0xd48;
  do {
    local_90.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
          0x100000001;
    local_90.fabArray._0_4_ = 1;
    PVar37 = Geometry::periodicity(&this->m_geom);
    local_190.p = PVar37.period.vect._0_8_;
    local_190.jstride._0_4_ = PVar37.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               ((long)(this->m_geom).super_CoordSys.offset + lVar13 + -8),0,1,(IntVect *)&local_90,
               (Periodicity *)&local_190,false);
    lVar13 = lVar13 + 0x180;
  } while (lVar13 != 0x11c8);
  MFIter::MFIter(&local_90,&(this->m_cellflag).super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                (&local_190,&this->m_cellflag,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)&this->m_areafrac,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&(this->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                 &local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&(this->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                 &local_90);
      if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
        iVar16 = local_1ac.smallend.vect[2];
        do {
          if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
            iVar15 = iVar16 + 1;
            iVar33 = local_1ac.smallend.vect[1];
            do {
              if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                iVar32 = iVar33 + 1;
                iVar11 = local_1ac.smallend.vect[0];
                do {
                  lVar13 = (long)iVar11;
                  lVar19 = ((long)iVar33 - (long)local_190.begin.y) *
                           CONCAT44(local_190.jstride._4_4_,(int)local_190.jstride);
                  lVar36 = ((long)iVar16 - (long)local_190.begin.z) * local_190.kstride;
                  uVar26 = local_190.p[lVar19 + (lVar13 - local_190.begin.x) + lVar36].flag & 0x1f;
                  if ((~local_190.p[lVar19 + (lVar13 - local_190.begin.x) + lVar36].flag & 3) != 0)
                  {
                    lVar23 = (long)(iVar11 - local_d0.begin.x);
                    lVar12 = (iVar33 - local_d0.begin.y) * local_d0.jstride;
                    lVar30 = (iVar16 - local_d0.begin.z) * local_d0.kstride;
                    dVar1 = local_d0.p[lVar12 + lVar23 + lVar30];
                    iVar27 = iVar11 + 1;
                    lVar8 = (long)(iVar27 - local_d0.begin.x);
                    dVar2 = local_d0.p[lVar12 + lVar8 + lVar30];
                    lVar24 = (long)(iVar11 - local_110.begin.x);
                    lVar9 = (iVar33 - local_110.begin.y) * local_110.jstride;
                    lVar17 = (iVar16 - local_110.begin.z) * local_110.kstride;
                    dVar3 = local_110.p[lVar9 + lVar24 + lVar17];
                    lVar20 = (iVar32 - local_110.begin.y) * local_110.jstride;
                    dVar4 = local_110.p[lVar20 + lVar24 + lVar17];
                    lVar35 = (long)(iVar11 - local_150.begin.x);
                    lVar25 = (iVar33 - local_150.begin.y) * local_150.jstride;
                    lVar14 = (iVar16 - local_150.begin.z) * local_150.kstride;
                    dVar5 = local_150.p[lVar25 + lVar35 + lVar14];
                    lVar10 = (iVar15 - local_150.begin.z) * local_150.kstride;
                    dVar6 = local_150.p[lVar25 + lVar35 + lVar10];
                    uVar26 = (-(uint)(dVar6 != 0.0) & 1) << 0x1b |
                             (-(uint)(dVar5 != 0.0) & 1) << 9 |
                             (-(uint)(dVar4 != 0.0) & 1) << 0x15 |
                             (-(uint)(dVar3 != 0.0) & 1) << 0xf |
                             (-(uint)(dVar2 != 0.0) & 1) << 0x13 |
                             (-(uint)(dVar1 != 0.0) & 1) << 0x11 | uVar26 | 0x40000;
                    uVar7 = ~local_d0.begin.y;
                    uVar22 = ~local_150.begin.x;
                    uVar28 = ~local_150.begin.y;
                    uVar34 = ~local_110.begin.x;
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_110.p[lVar9 + (int)(iVar11 + uVar34) + lVar17] != 0.0 ||
                         (NAN(local_110.p[lVar9 + (int)(iVar11 + uVar34) + lVar17]))))) ||
                       (((dVar3 != 0.0 || (NAN(dVar3))) &&
                        ((local_d0.p[(int)(uVar7 + iVar33) * local_d0.jstride + lVar23 + lVar30] !=
                          0.0 || (NAN(local_d0.p
                                      [(int)(uVar7 + iVar33) * local_d0.jstride + lVar23 + lVar30]))
                         ))))) {
                      lVar21 = (int)(iVar33 + uVar28) * local_150.jstride;
                      uVar18 = (-(uint)(local_150.p[lVar21 + (int)(iVar11 + uVar22) + lVar14] != 0.0
                                       ) & 1) << 5 | uVar26;
                      uVar26 = uVar18 | 0x4000;
                      if ((local_150.p[lVar21 + (int)(iVar11 + uVar22) + lVar10] != 0.0) ||
                         (NAN(local_150.p[lVar21 + (int)(iVar11 + uVar22) + lVar10]))) {
                        uVar26 = uVar18 | 0x804000;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_110.p[lVar9 + (iVar27 - local_110.begin.x) + lVar17] != 0.0 ||
                         (NAN(local_110.p[lVar9 + (iVar27 - local_110.begin.x) + lVar17]))))) ||
                       (((dVar3 != 0.0 || (NAN(dVar3))) &&
                        ((local_d0.p[(int)(uVar7 + iVar33) * local_d0.jstride + lVar8 + lVar30] !=
                          0.0 || (NAN(local_d0.p
                                      [(int)(uVar7 + iVar33) * local_d0.jstride + lVar8 + lVar30])))
                        )))) {
                      lVar21 = (int)(iVar33 + uVar28) * local_150.jstride;
                      uVar18 = (-(uint)(local_150.p[lVar21 + (iVar27 - local_150.begin.x) + lVar14]
                                       != 0.0) & 1) << 7 | uVar26;
                      uVar26 = uVar18 | 0x10000;
                      if ((local_150.p[lVar21 + (iVar27 - local_150.begin.x) + lVar10] != 0.0) ||
                         (NAN(local_150.p[lVar21 + (iVar27 - local_150.begin.x) + lVar10]))) {
                        uVar26 = uVar18 | 0x2010000;
                      }
                    }
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_110.p[lVar20 + (int)(iVar11 + uVar34) + lVar17] != 0.0 ||
                         (NAN(local_110.p[lVar20 + (int)(iVar11 + uVar34) + lVar17]))))) ||
                       (((dVar4 != 0.0 || (NAN(dVar4))) &&
                        ((local_d0.p
                          [(iVar32 - local_d0.begin.y) * local_d0.jstride + lVar23 + lVar30] != 0.0
                         || (NAN(local_d0.p
                                 [(iVar32 - local_d0.begin.y) * local_d0.jstride + lVar23 + lVar30])
                            )))))) {
                      lVar21 = (iVar32 - local_150.begin.y) * local_150.jstride;
                      uVar18 = (-(uint)(local_150.p[lVar21 + (int)(iVar11 + uVar22) + lVar14] != 0.0
                                       ) & 1) << 0xb | uVar26;
                      uVar26 = uVar18 | 0x100000;
                      if ((local_150.p[lVar21 + (int)(iVar11 + uVar22) + lVar10] != 0.0) ||
                         (NAN(local_150.p[lVar21 + (int)(iVar11 + uVar22) + lVar10]))) {
                        uVar26 = uVar18 | 0x20100000;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_110.p[lVar20 + (iVar27 - local_110.begin.x) + lVar17] != 0.0 ||
                         (NAN(local_110.p[lVar20 + (iVar27 - local_110.begin.x) + lVar17]))))) ||
                       (((dVar4 != 0.0 || (NAN(dVar4))) &&
                        ((local_d0.p
                          [(iVar32 - local_d0.begin.y) * local_d0.jstride + lVar8 + lVar30] != 0.0
                         || (NAN(local_d0.p
                                 [(iVar32 - local_d0.begin.y) * local_d0.jstride + lVar8 + lVar30]))
                         ))))) {
                      lVar17 = (iVar32 - local_150.begin.y) * local_150.jstride;
                      uVar18 = (-(uint)(local_150.p[lVar17 + (iVar27 - local_150.begin.x) + lVar14]
                                       != 0.0) & 1) << 0xd | uVar26;
                      uVar26 = uVar18 | 0x400000;
                      if ((local_150.p[lVar17 + (iVar27 - local_150.begin.x) + lVar10] != 0.0) ||
                         (NAN(local_150.p[lVar17 + (iVar27 - local_150.begin.x) + lVar10]))) {
                        uVar26 = uVar18 | 0x80400000;
                      }
                    }
                    uVar31 = ~local_d0.begin.z;
                    uVar18 = ~local_110.begin.z;
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_150.p[lVar25 + (int)(iVar11 + uVar22) + lVar14] != 0.0 ||
                         (NAN(local_150.p[lVar25 + (int)(iVar11 + uVar22) + lVar14]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_d0.p[lVar12 + lVar23 + (int)(iVar16 + uVar31) * local_d0.kstride] !=
                          0.0 || (NAN(local_d0.p
                                      [lVar12 + lVar23 + (int)(iVar16 + uVar31) * local_d0.kstride])
                                 )))))) {
                      lVar17 = (int)(iVar16 + uVar18) * local_110.kstride;
                      uVar29 = (-(uint)(local_110.p[lVar9 + (int)(iVar11 + uVar34) + lVar17] != 0.0)
                               & 1) << 5 | uVar26;
                      uVar26 = uVar29 | 0x100;
                      if ((local_110.p[lVar20 + (int)(iVar11 + uVar34) + lVar17] != 0.0) ||
                         (NAN(local_110.p[lVar20 + (int)(iVar11 + uVar34) + lVar17]))) {
                        uVar26 = uVar29 | 0x900;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_150.p[lVar25 + (iVar27 - local_150.begin.x) + lVar14] != 0.0 ||
                         (NAN(local_150.p[lVar25 + (iVar27 - local_150.begin.x) + lVar14]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_d0.p[lVar12 + lVar8 + (int)(iVar16 + uVar31) * local_d0.kstride] !=
                          0.0 || (NAN(local_d0.p
                                      [lVar12 + lVar8 + (int)(iVar16 + uVar31) * local_d0.kstride]))
                         ))))) {
                      lVar17 = (int)(iVar16 + uVar18) * local_110.kstride;
                      uVar29 = (-(uint)(local_110.p[lVar9 + (iVar27 - local_110.begin.x) + lVar17]
                                       != 0.0) & 1) << 7 | uVar26;
                      uVar26 = uVar29 | 0x400;
                      if ((local_110.p[lVar20 + (iVar27 - local_110.begin.x) + lVar17] != 0.0) ||
                         (NAN(local_110.p[lVar20 + (iVar27 - local_110.begin.x) + lVar17]))) {
                        uVar26 = uVar29 | 0x2400;
                      }
                    }
                    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
                        ((local_150.p[lVar25 + (int)(uVar22 + iVar11) + lVar10] != 0.0 ||
                         (NAN(local_150.p[lVar25 + (int)(uVar22 + iVar11) + lVar10]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_d0.p
                          [lVar12 + lVar23 + (iVar15 - local_d0.begin.z) * local_d0.kstride] != 0.0
                         || (NAN(local_d0.p
                                 [lVar12 + lVar23 + (iVar15 - local_d0.begin.z) * local_d0.kstride])
                            )))))) {
                      lVar17 = (iVar15 - local_110.begin.z) * local_110.kstride;
                      uVar22 = (-(uint)(local_110.p[lVar9 + (int)(iVar11 + uVar34) + lVar17] != 0.0)
                               & 1) << 0x17 | uVar26;
                      uVar26 = uVar22 | 0x4000000;
                      if ((local_110.p[lVar20 + (int)(iVar11 + uVar34) + lVar17] != 0.0) ||
                         (NAN(local_110.p[lVar20 + (int)(iVar11 + uVar34) + lVar17]))) {
                        uVar26 = uVar22 | 0x24000000;
                      }
                    }
                    if ((((dVar2 != 0.0) || (NAN(dVar2))) &&
                        ((local_150.p[lVar25 + (iVar27 - local_150.begin.x) + lVar10] != 0.0 ||
                         (NAN(local_150.p[lVar25 + (iVar27 - local_150.begin.x) + lVar10]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_d0.p
                          [lVar12 + lVar8 + (iVar15 - local_d0.begin.z) * local_d0.kstride] != 0.0
                         || (NAN(local_d0.p
                                 [lVar12 + lVar8 + (iVar15 - local_d0.begin.z) * local_d0.kstride]))
                         ))))) {
                      lVar12 = (iVar15 - local_110.begin.z) * local_110.kstride;
                      uVar22 = (-(uint)(local_110.p[lVar9 + (iVar27 - local_110.begin.x) + lVar12]
                                       != 0.0) & 1) << 0x19 | uVar26;
                      uVar26 = uVar22 | 0x10000000;
                      if ((local_110.p[lVar20 + (iVar27 - local_110.begin.x) + lVar12] != 0.0) ||
                         (NAN(local_110.p[lVar20 + (iVar27 - local_110.begin.x) + lVar12]))) {
                        uVar26 = uVar22 | 0x90000000;
                      }
                    }
                    if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                        ((local_150.p[(int)(iVar33 + uVar28) * local_150.jstride + lVar35 + lVar14]
                          != 0.0 ||
                         (NAN(local_150.p
                              [(int)(iVar33 + uVar28) * local_150.jstride + lVar35 + lVar14]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_110.p[lVar9 + lVar24 + (int)(iVar16 + uVar18) * local_110.kstride]
                          != 0.0 ||
                         (NAN(local_110.p
                              [lVar9 + lVar24 + (int)(iVar16 + uVar18) * local_110.kstride]))))))) {
                      lVar12 = (int)(uVar7 + iVar33) * local_d0.jstride;
                      lVar17 = (int)(iVar16 + uVar31) * local_d0.kstride;
                      uVar22 = (-(uint)(local_d0.p[lVar12 + lVar23 + lVar17] != 0.0) & 1) << 5 |
                               uVar26;
                      uVar26 = uVar22 | 0x40;
                      if ((local_d0.p[lVar12 + lVar8 + lVar17] != 0.0) ||
                         (NAN(local_d0.p[lVar12 + lVar8 + lVar17]))) {
                        uVar26 = uVar22 | 0xc0;
                      }
                    }
                    if ((((dVar4 != 0.0) || (NAN(dVar4))) &&
                        ((local_150.p
                          [(iVar32 - local_150.begin.y) * local_150.jstride + lVar35 + lVar14] !=
                          0.0 || (NAN(local_150.p
                                      [(iVar32 - local_150.begin.y) * local_150.jstride +
                                       lVar35 + lVar14]))))) ||
                       (((dVar5 != 0.0 || (NAN(dVar5))) &&
                        ((local_110.p[lVar20 + lVar24 + (int)(uVar18 + iVar16) * local_110.kstride]
                          != 0.0 ||
                         (NAN(local_110.p
                              [lVar20 + lVar24 + (int)(uVar18 + iVar16) * local_110.kstride])))))))
                    {
                      lVar12 = (iVar32 - local_d0.begin.y) * local_d0.jstride;
                      lVar14 = (int)(uVar31 + iVar16) * local_d0.kstride;
                      uVar22 = (-(uint)(local_d0.p[lVar12 + lVar23 + lVar14] != 0.0) & 1) << 0xb |
                               uVar26;
                      uVar26 = uVar22 | 0x1000;
                      if ((local_d0.p[lVar12 + lVar8 + lVar14] != 0.0) ||
                         (NAN(local_d0.p[lVar12 + lVar8 + lVar14]))) {
                        uVar26 = uVar22 | 0x3000;
                      }
                    }
                    if ((((dVar3 != 0.0) || (NAN(dVar3))) &&
                        ((local_150.p[(int)(uVar28 + iVar33) * local_150.jstride + lVar35 + lVar10]
                          != 0.0 ||
                         (NAN(local_150.p
                              [(int)(uVar28 + iVar33) * local_150.jstride + lVar35 + lVar10]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_110.p
                          [lVar9 + lVar24 + (iVar15 - local_110.begin.z) * local_110.kstride] != 0.0
                         || (NAN(local_110.p
                                 [lVar9 + lVar24 + (iVar15 - local_110.begin.z) * local_110.kstride]
                                ))))))) {
                      lVar9 = (int)(uVar7 + iVar33) * local_d0.jstride;
                      lVar12 = (iVar15 - local_d0.begin.z) * local_d0.kstride;
                      uVar7 = (-(uint)(local_d0.p[lVar9 + lVar23 + lVar12] != 0.0) & 1) << 0x17 |
                              uVar26;
                      uVar26 = uVar7 | 0x1000000;
                      if ((local_d0.p[lVar9 + lVar8 + lVar12] != 0.0) ||
                         (NAN(local_d0.p[lVar9 + lVar8 + lVar12]))) {
                        uVar26 = uVar7 | 0x3000000;
                      }
                    }
                    if ((((dVar4 != 0.0) || (NAN(dVar4))) &&
                        ((local_150.p
                          [(iVar32 - local_150.begin.y) * local_150.jstride + lVar35 + lVar10] !=
                          0.0 || (NAN(local_150.p
                                      [(iVar32 - local_150.begin.y) * local_150.jstride +
                                       lVar35 + lVar10]))))) ||
                       (((dVar6 != 0.0 || (NAN(dVar6))) &&
                        ((local_110.p
                          [lVar20 + lVar24 + (iVar15 - local_110.begin.z) * local_110.kstride] !=
                          0.0 || (NAN(local_110.p
                                      [lVar20 + lVar24 + (iVar15 - local_110.begin.z) *
                                                         local_110.kstride]))))))) {
                      lVar9 = (iVar32 - local_d0.begin.y) * local_d0.jstride;
                      lVar10 = (iVar15 - local_d0.begin.z) * local_d0.kstride;
                      uVar7 = (-(uint)(local_d0.p[lVar9 + lVar23 + lVar10] != 0.0) & 1) << 0x1d |
                              uVar26;
                      uVar26 = uVar7 | 0x40000000;
                      if ((local_d0.p[lVar9 + lVar8 + lVar10] != 0.0) ||
                         (NAN(local_d0.p[lVar9 + lVar8 + lVar10]))) {
                        uVar26 = uVar7 | 0xc0000000;
                      }
                    }
                  }
                  iVar11 = iVar11 + 1;
                  local_190.p[lVar19 + (lVar13 - local_190.begin.x) + lVar36].flag = uVar26;
                } while (iVar11 != local_1ac.bigend.vect[0] + 1);
              }
              iVar33 = iVar33 + 1;
            } while (iVar33 != local_1ac.bigend.vect[1] + 1);
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != local_1ac.bigend.vect[2] + 1);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Level::buildCellFlag ()
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].FillBoundary(0,1,{AMREX_D_DECL(1,1,1)},m_geom.periodicity());
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_cellflag,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& cflag = m_cellflag.array(mfi);
        AMREX_D_TERM(auto const& apx = m_areafrac[0].const_array(mfi);,
                     auto const& apy = m_areafrac[1].const_array(mfi);,
                     auto const& apz = m_areafrac[2].const_array(mfi););
        AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
        {
            amrex::ignore_unused(k);
            build_cellflag_from_ap(AMREX_D_DECL(i,j,k),
                                   cflag, AMREX_D_DECL(apx,apy,apz));
        });
    }
}